

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_growth_policy.h
# Opt level: O2

void __thiscall
tsl::rh::prime_growth_policy::prime_growth_policy
          (prime_growth_policy *this,size_t *min_bucket_count_in_out)

{
  unsigned_long *puVar1;
  unsigned_long uVar2;
  
  puVar1 = std::__lower_bound<unsigned_long_const*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                     (detail::PRIMES,&DAT_0011f728,min_bucket_count_in_out);
  if (puVar1 != (unsigned_long *)&DAT_0011f728) {
    this->m_iprime = (uint)((ulong)(puVar1 + -0x23eb2) >> 3);
    if (*min_bucket_count_in_out == 0) {
      uVar2 = 0;
    }
    else {
      uVar2 = *puVar1;
    }
    *min_bucket_count_in_out = uVar2;
    return;
  }
  std::terminate();
}

Assistant:

explicit prime_growth_policy(std::size_t& min_bucket_count_in_out) {
    auto it_prime = std::lower_bound(
        detail::PRIMES.begin(), detail::PRIMES.end(), min_bucket_count_in_out);
    if (it_prime == detail::PRIMES.end()) {
      TSL_RH_THROW_OR_TERMINATE(std::length_error,
                                "The hash table exceeds its maximum size.");
    }

    m_iprime = static_cast<unsigned int>(
        std::distance(detail::PRIMES.begin(), it_prime));
    if (min_bucket_count_in_out > 0) {
      min_bucket_count_in_out = *it_prime;
    } else {
      min_bucket_count_in_out = 0;
    }
  }